

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,uint64_t match_flags)

{
  int iVar1;
  char *__s;
  char *__s_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  size_type sVar7;
  void *pvVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  char *__data;
  long lVar12;
  ulong uVar13;
  string *psVar14;
  size_type sVar15;
  precise_unit pVar16;
  string cString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_c0;
  string local_a0;
  string *local_80;
  uint local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pVar16._8_8_ = un;
  pVar16.multiplier_ = *(double *)this;
  local_80 = __return_storage_ptr__;
  to_string_internal_abi_cxx11_(&local_c0,*(units **)(this + 8),pVar16,match_flags);
  local_74 = *(uint *)(this + 0xc);
  lVar12 = 0;
  do {
    __s = *(char **)(&DAT_0053b678 + lVar12);
    sVar6 = strlen(__s);
    sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,__s,
                 0,sVar6);
    if (sVar7 != 0xffffffffffffffff) {
      iVar5 = *(int *)(&DAT_0053b66c + lVar12);
      __s_00 = *(char **)((long)&PTR_anon_var_dwarf_2b0d2dc_0053b670 + lVar12);
      do {
        sVar6 = strlen(__s_00);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,sVar7
                ,(long)iVar5,__s_00,sVar6);
        iVar1 = *(int *)((long)&clean_unit_string(std::__cxx11::string,unsigned_int)::powerseq +
                        lVar12);
        sVar6 = strlen(__s);
        sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c0,__s,sVar7 + (long)iVar1,sVar6);
      } while (sVar7 != 0xffffffffffffffff);
    }
    uVar4 = local_74;
    _Var2._M_p = local_c0._M_dataplus._M_p;
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x108);
  uVar13 = local_c0._M_string_length;
  if (local_c0._M_string_length != 0) {
    if (((*local_c0._M_dataplus._M_p == '(') &&
        (local_c0._M_dataplus._M_p[local_c0._M_string_length - 1] == ')')) &&
       ((local_c0._M_string_length == 1 ||
        (pvVar8 = memchr(local_c0._M_dataplus._M_p + 1,0x28,local_c0._M_string_length - 1),
        pvVar8 == (void *)0x0 || (long)pvVar8 - (long)_Var2._M_p == -1)))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0);
      if (local_c0._M_string_length != 1) {
        if (local_c0._M_string_length == 2) {
          *local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p[1];
        }
        else {
          memmove(local_c0._M_dataplus._M_p,local_c0._M_dataplus._M_p + 1,
                  local_c0._M_string_length - 1);
        }
      }
      local_c0._M_dataplus._M_p[local_c0._M_string_length - 1] = '\0';
      local_c0._M_string_length = local_c0._M_string_length - 1;
    }
    sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 "00000",0,5);
    if (sVar7 != 0xffffffffffffffff) {
      reduce_number_length(&local_c0,'0');
    }
    sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 "99999",0,5);
    uVar13 = extraout_RDX;
    if (sVar7 != 0xffffffffffffffff) {
      reduce_number_length(&local_c0,'9');
      uVar13 = extraout_RDX_00;
    }
  }
  if (uVar4 != 0) {
    getCommodityName_abi_cxx11_
              (&local_a0,(units *)(ulong)((int)uVar4 >> 0x1f ^ uVar4),(uint32_t)uVar13);
    iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,0
                    ,7,"CXCOMM[");
    sVar3 = local_a0._M_string_length;
    _Var2._M_p = local_a0._M_dataplus._M_p;
    if (iVar5 != 0) {
      sVar7 = 0xffffffffffffffff;
      if (local_a0._M_string_length != 0) {
        sVar15 = 0;
        do {
          pvVar8 = memchr("{}[]()",(int)_Var2._M_p[sVar15],6);
          sVar7 = sVar15;
          if (pvVar8 != (void *)0x0) break;
          sVar15 = sVar15 + 1;
          sVar7 = 0xffffffffffffffff;
        } while (sVar3 != sVar15);
      }
LAB_003e3f32:
      if (sVar7 == 0) {
LAB_003e3f4a:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                   sVar7,1,'\\');
        sVar7 = sVar7 + 1;
      }
      else {
        if (sVar7 == 0xffffffffffffffff) goto LAB_003e3faa;
        if (local_a0._M_dataplus._M_p[sVar7 - 1] != '\\') goto LAB_003e3f4a;
      }
      sVar3 = local_a0._M_string_length;
      _Var2._M_p = local_a0._M_dataplus._M_p;
      uVar13 = sVar7 + 1;
      sVar7 = 0xffffffffffffffff;
      if (uVar13 < local_a0._M_string_length) {
        do {
          pvVar8 = memchr("{}[]()",(int)_Var2._M_p[uVar13],6);
          sVar7 = uVar13;
          if (pvVar8 != (void *)0x0) break;
          uVar13 = uVar13 + 1;
          sVar7 = 0xffffffffffffffff;
        } while (sVar3 != uVar13);
      }
      goto LAB_003e3f32;
    }
LAB_003e3faa:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,0,
                   0,1,'{');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,'}');
    psVar14 = local_80;
    uVar13 = local_c0._M_string_length;
    if ((int)local_74 < 0) {
      if (local_c0._M_string_length == 0) {
LAB_003e40b6:
        uVar9 = 0xffffffffffffffff;
      }
      else {
        do {
          uVar9 = uVar13 - 1;
          if (uVar13 == 0) goto LAB_003e40b6;
          lVar12 = uVar13 - 1;
          uVar13 = uVar9;
        } while (local_c0._M_dataplus._M_p[lVar12] != '/');
      }
      uVar13 = local_c0._M_string_length;
      if (uVar9 == 0xffffffffffffffff) {
        pVar16 = checkForCustomUnit(&local_a0);
        if (pVar16.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar16.multiplier_)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,0,1,
                 '1');
        }
        if (local_c0._M_string_length == 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                    '1');
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,'/'
                 );
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                  local_a0._M_dataplus._M_p,local_a0._M_string_length);
      }
      else {
        while (uVar13 != 0) {
          uVar13 = uVar13 - 1;
          if ((local_c0._M_dataplus._M_p[uVar13] == '*') ||
             (local_c0._M_dataplus._M_p[uVar13] == '^')) goto LAB_003e40eb;
        }
        uVar13 = 0xffffffffffffffff;
LAB_003e40eb:
        if (uVar13 == 0xffffffffffffffff || uVar13 < uVar9) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                    local_a0._M_dataplus._M_p,local_a0._M_string_length);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                  uVar13,0,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        }
      }
    }
    else {
      for (; uVar13 != 0; uVar13 = uVar13 - 1) {
        if ((local_c0._M_dataplus._M_p[uVar13 - 1] == '/') ||
           (local_c0._M_dataplus._M_p[uVar13 - 1] == '^')) {
          iVar5 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_c0,0,2,"1/");
          sVar3 = local_c0._M_string_length;
          _Var2._M_p = local_c0._M_dataplus._M_p;
          if (iVar5 != 0) {
            sVar7 = 0xffffffffffffffff;
            if (local_c0._M_string_length == 0) goto LAB_003e4210;
            uVar13 = 0;
            goto LAB_003e408a;
          }
          pVar16 = checkForCustomUnit(&local_a0);
          if (pVar16.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar16.multiplier_)) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,0,
                   1,'1');
          }
          _Var2._M_p = local_a0._M_dataplus._M_p;
          sVar6 = strlen(local_a0._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,0,1
                  ,_Var2._M_p,sVar6);
          goto LAB_003e4241;
        }
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                local_a0._M_dataplus._M_p,local_a0._M_string_length);
    }
    goto LAB_003e4241;
  }
  psVar14 = local_80;
  if ((local_c0._M_string_length != 0) && (9 < (byte)(*local_c0._M_dataplus._M_p - 0x30U))) {
    (local_80->_M_dataplus)._M_p = (pointer)&local_80->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
      (local_80->field_2)._M_allocated_capacity =
           CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&local_80->field_2 + 8) = local_c0.field_2._8_8_;
    }
    else {
      (local_80->_M_dataplus)._M_p = local_c0._M_dataplus._M_p;
      (local_80->field_2)._M_allocated_capacity =
           CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0]);
    }
    goto LAB_003e4290;
  }
  goto LAB_003e425c;
  while (uVar13 = uVar13 + 1, sVar7 = 0xffffffffffffffff, sVar3 != uVar13) {
LAB_003e408a:
    pvVar8 = memchr("^*/",(int)_Var2._M_p[uVar13],3);
    psVar14 = local_80;
    sVar7 = uVar13;
    if (pvVar8 != (void *)0x0) break;
  }
LAB_003e4210:
  if ((local_c0._M_dataplus._M_p[sVar7] == '^') && (local_c0._M_dataplus._M_p[sVar7 + 1] == '-')) {
    pVar16 = checkForCustomUnit(&local_a0);
    if (pVar16.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar16.multiplier_)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,0,1,
                 '1');
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_70,"*");
    pbVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_70,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    local_50._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
    paVar11 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar11) {
      local_50.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_50._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
               &local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,sVar7,
               0,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  }
LAB_003e4241:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
LAB_003e425c:
  (psVar14->_M_dataplus)._M_p = (pointer)&psVar14->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
    (psVar14->field_2)._M_allocated_capacity =
         CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&psVar14->field_2 + 8) = local_c0.field_2._8_8_;
  }
  else {
    (psVar14->_M_dataplus)._M_p = local_c0._M_dataplus._M_p;
    (psVar14->field_2)._M_allocated_capacity =
         CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,local_c0.field_2._M_local_buf[0]);
  }
LAB_003e4290:
  psVar14->_M_string_length = local_c0._M_string_length;
  return psVar14;
}

Assistant:

std::string to_string(const precise_unit& un, std::uint64_t match_flags)
{
    return clean_unit_string(
        to_string_internal(un, match_flags), un.commodity());
}